

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *interfaceNode)

{
  ElementCount EVar1;
  ListElementCount LVar2;
  uint uVar3;
  ulong uVar4;
  WirePointer id;
  uint64_t uVar5;
  byte bVar6;
  ulong __n;
  undefined1 *__s;
  ElementCount EVar7;
  bool bVar8;
  Array<bool> sawCodeOrder_heap;
  Reader method;
  Fault f;
  Reader methods;
  anon_class_8_1_60e9c21f _kjContextFunc435;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:435:7)>
  _kjContext435;
  bool sawCodeOrder_stack [32];
  undefined1 *local_198;
  ulong uStack_190;
  undefined8 *local_188;
  StructReader local_180;
  ArrayPtr<const_char> local_150;
  WirePointer *local_140;
  int local_138;
  ArrayPtr<const_char> local_130;
  WirePointer *local_120;
  int local_118;
  ListReader local_100;
  Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
  *local_d0;
  StructReader *local_c8;
  anon_class_8_1_6f242a07 local_c0;
  anon_class_16_2_3f8e8a0c local_b8;
  undefined1 local_a8 [24];
  ElementCount local_90;
  StructReader **local_60;
  undefined1 local_58 [40];
  
  if ((interfaceNode->_reader).pointerCount < 5) {
    local_100.elementCount = 0x7fffffff;
    local_100.capTable = (CapTableReader *)0x0;
    local_100.ptr = (byte *)0x0;
    local_100.segment = (SegmentReader *)0x0;
  }
  else {
    local_100.segment = (interfaceNode->_reader).segment;
    local_100.capTable = (interfaceNode->_reader).capTable;
    local_100.ptr = (byte *)((interfaceNode->_reader).pointers + 4);
    local_100.elementCount = (interfaceNode->_reader).nestingLimit;
  }
  EVar7 = 0;
  _::PointerReader::getList
            ((ListReader *)local_a8,(PointerReader *)&local_100,INLINE_COMPOSITE,(word *)0x0);
  if (local_90 != 0) {
    do {
      _::ListReader::getStructElement((StructReader *)&local_100,(ListReader *)local_a8,EVar7);
      if (local_100.structDataSize < 0x40) {
        id.offsetAndKind.value = 0;
        id.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        id = *(WirePointer *)local_100.ptr;
      }
      validateTypeId(this,(uint64_t)id,INTERFACE);
      if (local_100.structPointerCount == 0) {
        local_118 = 0x7fffffff;
        local_130.size_ = 0;
        local_120 = (WirePointer *)0x0;
        local_130.ptr = (char *)0x0;
      }
      else {
        local_120 = (WirePointer *)CONCAT44(local_100.step,local_100.elementCount);
        local_130.size_ = (size_t)local_100.capTable;
        local_130.ptr = (char *)local_100.segment;
        local_118 = local_100.nestingLimit;
      }
      _::PointerReader::getStruct(&local_180,(PointerReader *)&local_130,(word *)0x0);
      validate(this,(Reader *)&local_180);
      EVar7 = EVar7 + 1;
    } while (local_90 != EVar7);
  }
  if ((interfaceNode->_reader).pointerCount < 4) {
    local_90 = 0x7fffffff;
    local_a8._8_8_ = (ExceptionCallback *)0x0;
    local_a8._16_8_ = (WirePointer *)0x0;
    local_a8._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_a8._0_8_ = (interfaceNode->_reader).segment;
    local_a8._8_8_ = (interfaceNode->_reader).capTable;
    local_a8._16_8_ = (interfaceNode->_reader).pointers + 3;
    local_90 = (interfaceNode->_reader).nestingLimit;
  }
  _::PointerReader::getList(&local_100,(PointerReader *)local_a8,INLINE_COMPOSITE,(word *)0x0);
  LVar2 = local_100.elementCount;
  uVar4 = (ulong)local_100.elementCount;
  if (uVar4 < 0x21) {
    local_198 = (undefined1 *)0x0;
    uStack_190 = 0;
    local_188 = (undefined8 *)0x0;
  }
  else {
    local_198 = (undefined1 *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (1,uVar4,uVar4,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_188 = &kj::_::HeapArrayDisposer::instance;
    uStack_190 = uVar4;
  }
  __n = uStack_190;
  __s = local_198;
  if (LVar2 < 0x21) {
    __n = uVar4;
    __s = local_58;
  }
  EVar7 = 0;
  memset(__s,0,__n);
  if (local_100.elementCount != 0) {
    local_d0 = (Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                *)&this->members;
    EVar1 = local_100.elementCount - 1;
    do {
      _::ListReader::getStructElement(&local_180,&local_100,EVar7);
      local_c8 = &local_180;
      kj::_::Debug::Context::Context((Context *)local_a8);
      local_a8._0_8_ = &PTR__Context_00210018;
      local_60 = &local_c8;
      local_130.size_ = (size_t)local_180.capTable;
      local_120 = local_180.pointers;
      local_130.ptr = (char *)local_180.segment;
      local_118 = local_180.nestingLimit;
      if (local_180.pointerCount == 0) {
        local_130.size_ = (size_t)(CapTableReader *)0x0;
        local_120 = (WirePointer *)0x0;
        local_130.ptr = (char *)(SegmentReader *)0x0;
        local_118 = 0x7fffffff;
      }
      local_150 = (ArrayPtr<const_char>)
                  _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_130,(void *)0x0,0);
      local_b8.name = (StringPtr *)&local_150;
      local_120 = (WirePointer *)CONCAT44(local_120._4_4_,EVar7);
      local_c0.update = &local_b8;
      local_130 = local_150;
      local_b8.this = this;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                (local_d0,(Entry *)&local_130,&local_c0);
      uVar3 = 0;
      if (0xf < local_180.dataSize) {
        uVar3 = (uint)*local_180.data;
      }
      if (uVar3 < local_100.elementCount) {
        if (local_180.dataSize < 0x10) {
          uVar4 = 0;
        }
        else {
          uVar4 = (ulong)*local_180.data;
        }
        bVar6 = __s[uVar4] ^ 1;
      }
      else {
        bVar6 = 0;
      }
      if (bVar6 == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                  ((Fault *)&local_130,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x1b8,FAILED,
                   "method.getCodeOrder() < methods.size() && !sawCodeOrder[method.getCodeOrder()]",
                   "\"invalid codeOrder\"",(char (*) [18])"invalid codeOrder");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)&local_130);
      }
      else {
        if (local_180.dataSize < 0x10) {
          uVar4 = 0;
        }
        else {
          uVar4 = (ulong)*local_180.data;
        }
        __s[uVar4] = 1;
        if (local_180.dataSize < 0x80) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(uint64_t *)((long)local_180.data + 8);
        }
        validateTypeId(this,uVar5,STRUCT);
        if (local_180.pointerCount < 3) {
          local_138 = 0x7fffffff;
          local_150.size_ = 0;
          local_140 = (WirePointer *)0x0;
          local_150.ptr = (char *)0x0;
        }
        else {
          local_140 = local_180.pointers + 2;
          local_150.size_ = (size_t)local_180.capTable;
          local_150.ptr = (char *)local_180.segment;
          local_138 = local_180.nestingLimit;
        }
        _::PointerReader::getStruct
                  ((StructReader *)&local_130,(PointerReader *)&local_150,(word *)0x0);
        validate(this,(Reader *)&local_130);
        if (local_180.dataSize < 0xc0) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(uint64_t *)((long)local_180.data + 0x10);
        }
        validateTypeId(this,uVar5,STRUCT);
        if (local_180.pointerCount < 4) {
          local_138 = 0x7fffffff;
          local_150.size_ = 0;
          local_140 = (WirePointer *)0x0;
          local_150.ptr = (char *)0x0;
        }
        else {
          local_140 = local_180.pointers + 3;
          local_150.size_ = (size_t)local_180.capTable;
          local_150.ptr = (char *)local_180.segment;
          local_138 = local_180.nestingLimit;
        }
        _::PointerReader::getStruct
                  ((StructReader *)&local_130,(PointerReader *)&local_150,(word *)0x0);
        validate(this,(Reader *)&local_130);
      }
      kj::_::Debug::Context::~Context((Context *)local_a8);
      bVar8 = EVar1 != EVar7;
      EVar7 = EVar7 + 1;
    } while ((bVar6 & bVar8) != 0);
  }
  if (local_198 != (undefined1 *)0x0) {
    (**(code **)*local_188)(local_188,local_198,1,uStack_190,uStack_190,0);
  }
  return;
}

Assistant:

void validate(const schema::Node::Interface::Reader& interfaceNode) {
    for (auto extend: interfaceNode.getSuperclasses()) {
      validateTypeId(extend.getId(), schema::Node::INTERFACE);
      validate(extend.getBrand());
    }

    auto methods = interfaceNode.getMethods();
    KJ_STACK_ARRAY(bool, sawCodeOrder, methods.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto method: methods) {
      KJ_CONTEXT("validating method", method.getName());
      validateMemberName(method.getName(), index++);

      VALIDATE_SCHEMA(method.getCodeOrder() < methods.size() &&
                      !sawCodeOrder[method.getCodeOrder()],
                      "invalid codeOrder");
      sawCodeOrder[method.getCodeOrder()] = true;

      validateTypeId(method.getParamStructType(), schema::Node::STRUCT);
      validate(method.getParamBrand());
      validateTypeId(method.getResultStructType(), schema::Node::STRUCT);
      validate(method.getResultBrand());
    }
  }